

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deProcess.c
# Opt level: O3

void die(int statusPipe,char *message)

{
  size_t sVar1;
  
  sVar1 = strlen(message);
  printf("Process launch failed: %s\n",message);
  write(statusPipe,message,sVar1 + 1);
  exit(-1);
}

Assistant:

static void die (int statusPipe, const char* message)
{
	size_t	msgLen	= strlen(message);
	int		res		= 0;

	printf("Process launch failed: %s\n", message);
	res = (int)write(statusPipe, message, msgLen+1);
	DE_UNREF(res); /* No need to check result. */
	exit(-1);
}